

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_return::run_impl(statement_return *this)

{
  proxy *ppVar1;
  undefined8 *puVar2;
  runtime_error *this_00;
  error *this_01;
  undefined1 local_48 [8];
  undefined1 local_40 [20];
  undefined2 local_2c;
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  local_20;
  
  if (*(long *)(current_process + 0x88) == *(long *)(current_process + 0x80)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_40._0_8_ = local_40 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_48 + 8),"Return outside function.","");
    runtime_error::runtime_error(this_00,(string *)(local_48 + 8));
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  local_20.
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
  .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            )(this->mTree).mRoot;
  runtime_type::parse_expr
            ((runtime_type *)local_48,
             (iterator *)
             (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (bool)((char)local_40 + ' '));
  if (*(long *)(current_process + 0x88) != *(long *)(current_process + 0x80)) {
    puVar2 = (undefined8 *)(*(long *)(current_process + 0x88) + -8);
    if ((undefined8 *)local_48 != puVar2) {
      ppVar1 = (proxy *)*puVar2;
      *puVar2 = local_48;
      local_48 = (undefined1  [8])ppVar1;
    }
    cs_impl::any::recycle((any *)local_48);
    ((((this->super_statement_base).context.
       super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
     super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->return_fcall = true;
    return;
  }
  this_01 = (error *)__cxa_allocate_exception(0x28);
  local_40._0_8_ = local_40 + 0x10;
  local_40._16_4_ = 0x30303045;
  local_2c = 0x48;
  local_40._8_8_ = 5;
  cov::error::error(this_01,(string *)(local_48 + 8));
  __cxa_throw(this_01,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

void statement_return::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (current_process->stack.empty())
			throw runtime_error("Return outside function.");
		current_process->stack.top() = context->instance->parse_expr(this->mTree.root());
		context->instance->return_fcall = true;
	}